

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpropertyanimation.cpp
# Opt level: O2

void __thiscall QPropertyAnimationPrivate::updateMetaProperty(QPropertyAnimationPrivate *this)

{
  QObjectCompatProperty<QPropertyAnimationPrivate,_QByteArray,_&QPropertyAnimationPrivate::_qt_property_propertyName_offset,_&QPropertyAnimationPrivate::setPropertyName,_nullptr,_nullptr>
  *this_00;
  QObject *this_01;
  bool bVar1;
  int iVar2;
  parameter_type pQVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar4;
  char *msg;
  long in_FS_OFFSET;
  anon_union_24_3_e3d07ef4_for_data local_50;
  char *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = (this->targetObject).super_QPropertyData<QObject_*>.val;
  if (this_01 != (QObject *)0x0) {
    this_00 = &this->propertyName;
    pQVar3 = QObjectCompatProperty<QPropertyAnimationPrivate,_QByteArray,_&QPropertyAnimationPrivate::_qt_property_propertyName_offset,_&QPropertyAnimationPrivate::setPropertyName,_nullptr,_nullptr>
             ::value(this_00);
    if ((pQVar3->d).size != 0) {
      pQVar3 = QObjectCompatProperty<QPropertyAnimationPrivate,_QByteArray,_&QPropertyAnimationPrivate::_qt_property_propertyName_offset,_&QPropertyAnimationPrivate::setPropertyName,_nullptr,_nullptr>
               ::value(this_00);
      pcVar4 = (pQVar3->d).ptr;
      if (pcVar4 == (char *)0x0) {
        pcVar4 = &QByteArray::_empty;
      }
      QObject::property((QVariant *)&local_50,this_01,pcVar4);
      iVar2 = ::QVariant::typeId((QVariant *)&local_50);
      this->propertyType = iVar2;
      ::QVariant::~QVariant((QVariant *)&local_50);
      iVar2 = (**this_01->_vptr_QObject)(this_01);
      pQVar3 = QObjectCompatProperty<QPropertyAnimationPrivate,_QByteArray,_&QPropertyAnimationPrivate::_qt_property_propertyName_offset,_&QPropertyAnimationPrivate::setPropertyName,_nullptr,_nullptr>
               ::value(this_00);
      pcVar4 = (pQVar3->d).ptr;
      if (pcVar4 == (char *)0x0) {
        pcVar4 = &QByteArray::_empty;
      }
      iVar2 = QMetaObject::indexOfProperty((QMetaObject *)CONCAT44(extraout_var,iVar2),pcVar4);
      this->propertyIndex = iVar2;
      if (this->propertyType != 0) {
        QVariantAnimationPrivate::convertValues
                  (&this->super_QVariantAnimationPrivate,this->propertyType);
        iVar2 = this->propertyIndex;
      }
      if (iVar2 == -1) {
        this->propertyType = 0;
        QObject::dynamicPropertyNames((QList<QByteArray> *)&local_50,this_01);
        bVar1 = QListSpecialMethodsBase<QByteArray>::
                contains<QObjectCompatProperty<QPropertyAnimationPrivate,_QByteArray,_&QPropertyAnimationPrivate::_qt_property_propertyName_offset,_&QPropertyAnimationPrivate::setPropertyName,_nullptr,_nullptr>_>
                          ((QListSpecialMethodsBase<QByteArray> *)local_50.data,this_00);
        QArrayDataPointer<QByteArray>::~QArrayDataPointer
                  ((QArrayDataPointer<QByteArray> *)&local_50);
        if (bVar1) goto LAB_00368712;
        local_50._0_4_ = 2;
        local_50._20_4_ = 0;
        local_50._4_8_ = 0;
        local_50._12_8_ = 0;
        local_38 = "default";
        pQVar3 = QObjectCompatProperty<QPropertyAnimationPrivate,_QByteArray,_&QPropertyAnimationPrivate::_qt_property_propertyName_offset,_&QPropertyAnimationPrivate::setPropertyName,_nullptr,_nullptr>
                 ::value(this_00);
        pcVar4 = (pQVar3->d).ptr;
        if (pcVar4 == (char *)0x0) {
          pcVar4 = &QByteArray::_empty;
        }
        msg = 
        "QPropertyAnimation: you\'re trying to animate a non-existing property %s of your QObject";
      }
      else {
        iVar2 = (**this_01->_vptr_QObject)(this_01);
        QMetaObject::property
                  ((QMetaProperty *)&local_50,(QMetaObject *)CONCAT44(extraout_var_00,iVar2),
                   this->propertyIndex);
        bVar1 = QMetaProperty::isWritable((QMetaProperty *)&local_50);
        if (bVar1) goto LAB_00368712;
        local_50._0_4_ = 2;
        local_50._20_4_ = 0;
        local_50._4_8_ = 0;
        local_50._12_8_ = 0;
        local_38 = "default";
        pQVar3 = QObjectCompatProperty<QPropertyAnimationPrivate,_QByteArray,_&QPropertyAnimationPrivate::_qt_property_propertyName_offset,_&QPropertyAnimationPrivate::setPropertyName,_nullptr,_nullptr>
                 ::value(this_00);
        pcVar4 = (pQVar3->d).ptr;
        if (pcVar4 == (char *)0x0) {
          pcVar4 = &QByteArray::_empty;
        }
        msg = 
        "QPropertyAnimation: you\'re trying to animate the non-writable property %s of your QObject"
        ;
      }
      QMessageLogger::warning((QMessageLogger *)&local_50,msg,pcVar4);
      goto LAB_00368712;
    }
  }
  this->propertyType = 0;
  this->propertyIndex = -1;
LAB_00368712:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPropertyAnimationPrivate::updateMetaProperty()
{
    const QObject *target = targetObject.valueBypassingBindings();
    if (!target || propertyName.value().isEmpty()) {
        propertyType = QMetaType::UnknownType;
        propertyIndex = -1;
        return;
    }

    //propertyType will be set to a valid type only if there is a Q_PROPERTY
    //otherwise it will be set to QVariant::Invalid at the end of this function
    propertyType = target->property(propertyName.value()).userType();
    propertyIndex = target->metaObject()->indexOfProperty(propertyName.value());

    if (propertyType != QMetaType::UnknownType)
        convertValues(propertyType);
    if (propertyIndex == -1) {
        //there is no Q_PROPERTY on the object
        propertyType = QMetaType::UnknownType;
        if (!target->dynamicPropertyNames().contains(propertyName))
            qWarning("QPropertyAnimation: you're trying to animate a non-existing property %s of "
                     "your QObject",
                     propertyName.value().constData());
    } else if (!target->metaObject()->property(propertyIndex).isWritable()) {
        qWarning("QPropertyAnimation: you're trying to animate the non-writable property %s of "
                 "your QObject",
                 propertyName.value().constData());
    }
}